

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O2

void __thiscall
rsg::ProgramExecutor::setTexture
          (ProgramExecutor *this,int samplerNdx,Texture2D *texture,Sampler *sampler)

{
  undefined8 uVar1;
  mapped_type *this_00;
  int local_54;
  Sampler2D local_50;
  
  local_50.m_sampler.wrapS = sampler->wrapS;
  local_50.m_sampler.wrapT = sampler->wrapT;
  local_50.m_sampler.wrapR = sampler->wrapR;
  local_50.m_sampler.minFilter = sampler->minFilter;
  local_50.m_sampler.magFilter = sampler->magFilter;
  local_50.m_sampler.lodThreshold = sampler->lodThreshold;
  local_50.m_sampler.normalizedCoords = sampler->normalizedCoords;
  local_50.m_sampler._25_3_ = *(undefined3 *)&sampler->field_0x19;
  local_50.m_sampler.compare = sampler->compare;
  local_50.m_sampler._32_8_ = *(undefined8 *)&sampler->compareChannel;
  uVar1 = *(undefined8 *)((long)&(sampler->borderColor).v + 8);
  local_50.m_sampler.seamlessCubeMap = sampler->seamlessCubeMap;
  local_50.m_sampler._53_3_ = *(undefined3 *)&sampler->field_0x35;
  local_50.m_sampler.depthStencilMode = sampler->depthStencilMode;
  local_50.m_sampler.borderColor.v.uData[1] =
       (deUint32)*(undefined8 *)((long)&(sampler->borderColor).v + 4);
  local_50.m_sampler.borderColor.v.uData[2] = (deUint32)uVar1;
  local_50.m_sampler.borderColor.v.uData[3] = (deUint32)((ulong)uVar1 >> 0x20);
  local_54 = samplerNdx;
  local_50.m_texture = texture;
  this_00 = std::
            map<int,_rsg::Sampler2D,_std::less<int>,_std::allocator<std::pair<const_int,_rsg::Sampler2D>_>_>
            ::operator[](&this->m_samplers2D,&local_54);
  Sampler2D::operator=(this_00,&local_50);
  return;
}

Assistant:

void ProgramExecutor::setTexture (int samplerNdx, const tcu::Texture2D* texture, const tcu::Sampler& sampler)
{
	m_samplers2D[samplerNdx] = Sampler2D(texture, sampler);
}